

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr TIFFReadDirEntrySlong(TIFF *tif,TIFFDirEntry *direntry,int32_t *value)

{
  int64_t local_48;
  int64_t m_6;
  uint64_t m_5;
  uint32_t m_4;
  TIFFReadDirEntryErr TStack_2c;
  int16_t m_3;
  uint16_t m_2;
  int8_t m_1;
  uint8_t m;
  TIFFReadDirEntryErr err;
  int32_t *value_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  if (direntry->tdir_count == 1) {
    _m_2 = (uint *)value;
    value_local = (int32_t *)direntry;
    direntry_local = (TIFFDirEntry *)tif;
    switch(direntry->tdir_type) {
    case 1:
      TIFFReadDirEntryCheckedByte(tif,direntry,(uint8_t *)((long)&m_4 + 3));
      *_m_2 = (uint)m_4._3_1_;
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    default:
      tif_local._4_4_ = TIFFReadDirEntryErrType;
      break;
    case 3:
      TIFFReadDirEntryCheckedShort(tif,direntry,(uint16_t *)&m_4);
      *_m_2 = (uint)(ushort)m_4;
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    case 4:
      TIFFReadDirEntryCheckedLong(tif,direntry,(uint32_t *)&m_5);
      tif_local._4_4_ = TIFFReadDirEntryCheckRangeSlongLong((uint32_t)m_5);
      if (tif_local._4_4_ == TIFFReadDirEntryErrOk) {
        *_m_2 = (uint32_t)m_5;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      break;
    case 6:
      TIFFReadDirEntryCheckedSbyte(tif,direntry,(int8_t *)((long)&m_4 + 2));
      *_m_2 = (int)m_4._2_1_;
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    case 8:
      TIFFReadDirEntryCheckedSshort(tif,direntry,(int16_t *)((long)&m_5 + 6));
      *_m_2 = (int)m_5._6_2_;
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    case 9:
      TIFFReadDirEntryCheckedSlong(tif,direntry,value);
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    case 0x10:
      TStack_2c = TIFFReadDirEntryCheckedLong8(tif,direntry,(uint64_t *)&m_6);
      tif_local._4_4_ = TStack_2c;
      if ((TStack_2c == TIFFReadDirEntryErrOk) &&
         (tif_local._4_4_ = TIFFReadDirEntryCheckRangeSlongLong8(m_6),
         tif_local._4_4_ == TIFFReadDirEntryErrOk)) {
        *_m_2 = (int32_t)m_6;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      break;
    case 0x11:
      TStack_2c = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_48);
      tif_local._4_4_ = TStack_2c;
      if ((TStack_2c == TIFFReadDirEntryErrOk) &&
         (tif_local._4_4_ = TIFFReadDirEntryCheckRangeSlongSlong8(local_48),
         tif_local._4_4_ == TIFFReadDirEntryErrOk)) {
        *_m_2 = (int32_t)local_48;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
    }
  }
  else {
    tif_local._4_4_ = TIFFReadDirEntryErrCount;
  }
  return tif_local._4_4_;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySlong(TIFF *tif, TIFFDirEntry *direntry, int32_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
        {
            uint16_t m;
            TIFFReadDirEntryCheckedShort(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
        {
            int16_t m;
            TIFFReadDirEntryCheckedSshort(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSlongLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
            TIFFReadDirEntryCheckedSlong(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSlongLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSlongSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}